

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

bool tinyexr::ConvertHeader(EXRHeader *exr_header,HeaderInfo *info,string *warn,string *err)

{
  string *__lhs;
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  ostream *poVar5;
  ulong uVar6;
  EXRChannelInfo *pEVar7;
  int *piVar8;
  EXRAttribute *pEVar9;
  int *piVar10;
  size_t c;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  pointer pTVar14;
  size_t i;
  long lVar15;
  pointer pTVar16;
  string local_1d8 [32];
  stringstream ss;
  ostream local_1a8 [376];
  
  exr_header->pixel_aspect_ratio = info->pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info->screen_window_center[0];
  exr_header->screen_window_center[1] = info->screen_window_center[1];
  exr_header->screen_window_width = info->screen_window_width;
  exr_header->chunk_count = info->chunk_count;
  iVar1 = (info->display_window).min_y;
  iVar2 = (info->display_window).max_x;
  iVar3 = (info->display_window).max_y;
  (exr_header->display_window).min_x = (info->display_window).min_x;
  (exr_header->display_window).min_y = iVar1;
  (exr_header->display_window).max_x = iVar2;
  (exr_header->display_window).max_y = iVar3;
  iVar1 = (info->data_window).min_y;
  iVar2 = (info->data_window).max_x;
  iVar3 = (info->data_window).max_y;
  (exr_header->data_window).min_x = (info->data_window).min_x;
  (exr_header->data_window).min_y = iVar1;
  (exr_header->data_window).max_x = iVar2;
  (exr_header->data_window).max_y = iVar3;
  exr_header->line_order = info->line_order;
  exr_header->compression_type = info->compression_type;
  iVar1 = info->tile_size_x;
  iVar2 = info->tile_size_y;
  iVar3 = info->tile_level_mode;
  exr_header->tiled = info->tiled;
  exr_header->tile_size_x = iVar1;
  exr_header->tile_size_y = iVar2;
  exr_header->tile_level_mode = iVar3;
  exr_header->tile_rounding_mode = info->tile_rounding_mode;
  EXRSetNameAttr(exr_header,(info->name)._M_dataplus._M_p);
  if ((info->type)._M_string_length != 0) {
    __lhs = &info->type;
    bVar4 = std::operator==(__lhs,"scanlineimage");
    if (bVar4) {
      if (exr_header->tiled != 0) {
joined_r0x0010570e:
        if (err != (string *)0x0) {
          std::__cxx11::string::append((char *)err);
        }
        return false;
      }
    }
    else {
      bVar4 = std::operator==(__lhs,"tiledimage");
      if (bVar4) {
        iVar1 = exr_header->tiled;
      }
      else {
        bVar4 = std::operator==(__lhs,"deeptile");
        if (!bVar4) {
          bVar4 = std::operator==(__lhs,"deepscanline");
          if (bVar4) {
            exr_header->non_image = 1;
            if ((err != (string *)0x0) && (exr_header->tiled != 0)) {
              std::__cxx11::string::append((char *)err);
            }
          }
          else if (warn != (string *)0x0) {
            std::__cxx11::stringstream::stringstream((stringstream *)&ss);
            poVar5 = std::operator<<(local_1a8,"(ConvertHeader) Unsupported or unknown info.type: ")
            ;
            poVar5 = std::operator<<(poVar5,(string *)__lhs);
            std::operator<<(poVar5,"\n");
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::append((string *)warn);
            std::__cxx11::string::~string(local_1d8);
            std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          }
          goto LAB_001057ca;
        }
        exr_header->non_image = 1;
        iVar1 = exr_header->tiled;
      }
      if (iVar1 == 0) goto joined_r0x0010570e;
    }
  }
LAB_001057ca:
  pTVar14 = (info->channels).
            super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar6 = ((long)(info->channels).
                 super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pTVar14) / 0x38;
  exr_header->num_channels = (int)uVar6;
  pEVar7 = (EXRChannelInfo *)malloc((long)(int)uVar6 * 0x110);
  exr_header->channels = pEVar7;
  lVar15 = 0;
  lVar12 = 0;
  for (uVar11 = 0; uVar6 = (ulong)(int)uVar6, uVar11 < uVar6; uVar11 = uVar11 + 1) {
    strncpy(pEVar7->name + lVar15,*(char **)(pTVar14->pad + lVar12 + -0x31),0xff);
    exr_header->channels->pad[lVar15 + -0xe] = '\0';
    pTVar14 = (info->channels).
              super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pEVar7 = exr_header->channels;
    *(undefined4 *)(pEVar7->pad + lVar15 + -0xd) =
         *(undefined4 *)(pTVar14->pad + lVar12 + 0xffffffffffffffef);
    pEVar7->pad[lVar15 + -1] = pTVar14->pad[lVar12 + 0xffffffffffffffff];
    *(undefined8 *)(pEVar7->pad + lVar15 + -9) =
         *(undefined8 *)(pTVar14->pad + lVar12 + 0xfffffffffffffff7);
    uVar6 = (ulong)(uint)exr_header->num_channels;
    lVar12 = lVar12 + 0x38;
    lVar15 = lVar15 + 0x110;
  }
  piVar8 = (int *)malloc(uVar6 * 4);
  exr_header->pixel_types = piVar8;
  piVar10 = &((info->channels).
              super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
              _M_impl.super__Vector_impl_data._M_start)->pixel_type;
  for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
    piVar8[uVar11] = *piVar10;
    piVar10 = piVar10 + 0xe;
  }
  piVar8 = (int *)malloc(uVar6 * 4);
  exr_header->requested_pixel_types = piVar8;
  piVar10 = &((info->channels).
              super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
              _M_impl.super__Vector_impl_data._M_start)->pixel_type;
  for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
    piVar8[uVar11] = *piVar10;
    piVar10 = piVar10 + 0xe;
  }
  pTVar16 = (info->attributes).super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar6 = ((long)(info->attributes).
                 super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pTVar16) / 0x210;
  uVar13 = (uint)uVar6;
  exr_header->num_custom_attributes = uVar13;
  if ((int)uVar13 < 1) {
    exr_header->custom_attributes = (EXRAttribute *)0x0;
  }
  else {
    if (0x80 < uVar13) {
      exr_header->num_custom_attributes = 0x80;
      uVar6 = 0x80;
    }
    pEVar9 = (EXRAttribute *)malloc((ulong)(uint)((int)uVar6 * 0x210));
    exr_header->custom_attributes = pEVar9;
    lVar12 = 0;
    for (uVar11 = 0; uVar11 < (ulong)(long)(int)uVar6; uVar11 = uVar11 + 1) {
      memcpy(pEVar9->name + lVar12,pTVar16->name + lVar12,0x100);
      memcpy(exr_header->custom_attributes->type + lVar12,
             ((info->attributes).super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>.
              _M_impl.super__Vector_impl_data._M_start)->type + lVar12,0x100);
      pTVar16 = (info->attributes).super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pEVar9 = exr_header->custom_attributes;
      *(undefined4 *)((long)&pEVar9->size + lVar12) = *(undefined4 *)((long)&pTVar16->size + lVar12)
      ;
      *(undefined8 *)((long)&pEVar9->value + lVar12) =
           *(undefined8 *)((long)&pTVar16->value + lVar12);
      uVar6 = (ulong)(uint)exr_header->num_custom_attributes;
      lVar12 = lVar12 + 0x210;
    }
  }
  exr_header->header_len = info->header_len;
  return true;
}

Assistant:

static bool ConvertHeader(EXRHeader *exr_header, const HeaderInfo &info, std::string *warn, std::string *err) {
  exr_header->pixel_aspect_ratio = info.pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info.screen_window_center[0];
  exr_header->screen_window_center[1] = info.screen_window_center[1];
  exr_header->screen_window_width = info.screen_window_width;
  exr_header->chunk_count = info.chunk_count;
  exr_header->display_window.min_x = info.display_window.min_x;
  exr_header->display_window.min_y = info.display_window.min_y;
  exr_header->display_window.max_x = info.display_window.max_x;
  exr_header->display_window.max_y = info.display_window.max_y;
  exr_header->data_window.min_x = info.data_window.min_x;
  exr_header->data_window.min_y = info.data_window.min_y;
  exr_header->data_window.max_x = info.data_window.max_x;
  exr_header->data_window.max_y = info.data_window.max_y;
  exr_header->line_order = info.line_order;
  exr_header->compression_type = info.compression_type;
  exr_header->tiled = info.tiled;
  exr_header->tile_size_x = info.tile_size_x;
  exr_header->tile_size_y = info.tile_size_y;
  exr_header->tile_level_mode = info.tile_level_mode;
  exr_header->tile_rounding_mode = info.tile_rounding_mode;

  EXRSetNameAttr(exr_header, info.name.c_str());


  if (!info.type.empty()) {
    bool valid = true;
    if (info.type == "scanlineimage") {
      if (exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be off for `scanlineimage` type.\n";
        }
        valid = false;
      }
    } else if (info.type == "tiledimage") {
      if (!exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be on for `tiledimage` type.\n";
        }
        valid = false;
      }
    } else if (info.type == "deeptile") {
      exr_header->non_image = 1;
      if (!exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be on for `deeptile` type.\n";
        }
        valid = false;
      }
    } else if (info.type == "deepscanline") {
      exr_header->non_image = 1;
      if (exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be off for `deepscanline` type.\n";
        }
        //valid = false;
      }
    } else {
      if (warn) {
        std::stringstream ss;
        ss << "(ConvertHeader) Unsupported or unknown info.type: " << info.type << "\n";
        (*warn) += ss.str();
      }
    }

    if (!valid) {
      return false;
    }
  }

  exr_header->num_channels = static_cast<int>(info.channels.size());

  exr_header->channels = static_cast<EXRChannelInfo *>(malloc(
      sizeof(EXRChannelInfo) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
#ifdef _MSC_VER
    strncpy_s(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#else
    strncpy(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#endif
    // manually add '\0' for safety.
    exr_header->channels[c].name[255] = '\0';

    exr_header->channels[c].pixel_type = info.channels[c].pixel_type;
    exr_header->channels[c].p_linear = info.channels[c].p_linear;
    exr_header->channels[c].x_sampling = info.channels[c].x_sampling;
    exr_header->channels[c].y_sampling = info.channels[c].y_sampling;
  }

  exr_header->pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->pixel_types[c] = info.channels[c].pixel_type;
  }

  // Initially fill with values of `pixel_types`
  exr_header->requested_pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->requested_pixel_types[c] = info.channels[c].pixel_type;
  }

  exr_header->num_custom_attributes = static_cast<int>(info.attributes.size());

  if (exr_header->num_custom_attributes > 0) {
    // TODO(syoyo): Report warning when # of attributes exceeds
    // `TINYEXR_MAX_CUSTOM_ATTRIBUTES`
    if (exr_header->num_custom_attributes > TINYEXR_MAX_CUSTOM_ATTRIBUTES) {
      exr_header->num_custom_attributes = TINYEXR_MAX_CUSTOM_ATTRIBUTES;
    }

    exr_header->custom_attributes = static_cast<EXRAttribute *>(malloc(
        sizeof(EXRAttribute) * size_t(exr_header->num_custom_attributes)));

    for (size_t i = 0; i < size_t(exr_header->num_custom_attributes); i++) {
      memcpy(exr_header->custom_attributes[i].name, info.attributes[i].name,
             256);
      memcpy(exr_header->custom_attributes[i].type, info.attributes[i].type,
             256);
      exr_header->custom_attributes[i].size = info.attributes[i].size;
      // Just copy pointer
      exr_header->custom_attributes[i].value = info.attributes[i].value;
    }

  } else {
    exr_header->custom_attributes = NULL;
  }

  exr_header->header_len = info.header_len;

  return true;
}